

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONChildren.h
# Opt level: O2

void __thiscall
jsonChildren::insert(jsonChildren *this,JSONNode ***position,JSONNode *item,bool reverse)

{
  uint uVar1;
  JSONNode **ppJVar2;
  undefined3 in_register_00000009;
  ulong uVar3;
  JSONNode **ppJVar4;
  
  if (CONCAT31(in_register_00000009,reverse) == 0) {
    ppJVar4 = *position;
    ppJVar2 = this->array;
    inc(this);
    ppJVar4 = (JSONNode **)(((long)ppJVar4 - (long)ppJVar2 & 0x7fffffff8U) + (long)this->array);
    uVar3 = (ulong)this->mysize;
  }
  else {
    uVar1 = this->mysize;
    ppJVar4 = this->array;
    ppJVar2 = *position;
    inc(this);
    uVar3 = (ulong)this->mysize;
    ppJVar4 = (JSONNode **)
              ((long)this->array +
              (uVar3 * 8 - ((long)ppJVar4 + ((ulong)uVar1 * 8 - (long)ppJVar2) & 0x7fffffff8)));
  }
  *position = ppJVar4;
  this->mysize = (int)uVar3 + 1;
  memmove(ppJVar4 + 1,ppJVar4,(uVar3 - ((ulong)((long)ppJVar4 - (long)this->array) >> 3)) * 8);
  **position = item;
  return;
}

Assistant:

void insert(JSONNode ** & position, JSONNode * item, bool reverse = false) json_nothrow {
    #endif
	   JSON_ASSERT(this != 0, JSON_TEXT("Children is null insert"));
	   //position isnt relative to array because of realloc
	   JSON_ASSERT(position >= array, JSON_TEXT("position is beneath the start of the array insert 1"));
	   JSON_ASSERT(position <= array + mysize, JSON_TEXT("position is above the end of the array insert 1"));
		#ifndef JSON_LIBRARY
		if (reverse){
			iteratorKeeper<true> ik(this, position);
			inc();
		} else 
		#endif
		{
			iteratorKeeper<false> ik(this, position);
			inc();
		}

	   std::memmove(position + 1, position, (mysize++ - (position - array)) * sizeof(JSONNode *));
	   *position = item;
    }